

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_file_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::basic_file_sink<std::mutex>::sink_it_(basic_file_sink<std::mutex> *this,log_msg *msg)

{
  pointer pfVar1;
  size_t in_RCX;
  void *__buf;
  undefined8 in_RSI;
  allocator<char> *in_RDI;
  memory_buf_t formatted;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *this_00;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> local_130;
  undefined8 local_10;
  
  this_00 = &local_130;
  local_10 = in_RSI;
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  basic_memory_buffer(this_00,in_RDI);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x698794);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,this_00);
  details::file_helper::write((file_helper *)(in_RDI + 0x40),(int)&local_130,__buf,in_RCX);
  ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
  ~basic_memory_buffer
            ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x6987cd);
  return;
}

Assistant:

SPDLOG_INLINE void basic_file_sink<Mutex>::sink_it_(const details::log_msg &msg) {
    memory_buf_t formatted;
    base_sink<Mutex>::formatter_->format(msg, formatted);
    file_helper_.write(formatted);
}